

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_miniscript_pk_k
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int ret;
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  int32_t derive_child_num_local;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  if (((node->child == (miniscript_node_t *)0x0) || (script_len < 0x42)) ||
     ((parent != (miniscript_node_t *)0x0 && (parent->info == (miniscript_item_t *)0x0)))) {
    node_local._4_4_ = -2;
  }
  else {
    node_local._4_4_ =
         generate_script_from_miniscript
                   (node->child,node,derive_child_num,script + 1,script_len - 1,write_len);
    if (node_local._4_4_ == 0) {
      if (*write_len + 1 < 0x209) {
        *script = (uchar)*write_len;
        *write_len = *write_len + 1;
      }
      else {
        node_local._4_4_ = -2;
      }
    }
  }
  return node_local._4_4_;
}

Assistant:

static int generate_by_miniscript_pk_k(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;

    if (!node->child || (script_len < EC_PUBLIC_KEY_LEN * 2) || (parent && !parent->info))
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(node->child, node, derive_child_num, &script[1], script_len - 1, write_len);
    if (ret != WALLY_OK)
        return ret;

    if (*write_len + 1 > DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE)
        return WALLY_EINVAL;

    script[0] = (unsigned char)*write_len;
    ++(*write_len);
    return ret;
}